

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformsurface.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QPlatformSurface *surface)

{
  QSurface *this;
  SurfaceClass SVar1;
  uint uVar2;
  void *in_RDX;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  undefined1 local_88 [32];
  QDebug local_68;
  QDebug local_60;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)surface);
  pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
  pQVar3[0x30] = (QTextStream)0x0;
  QVar4.m_data = (storage_type *)0x11;
  QVar4.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
  }
  QTextStream::operator<<(pQVar3,in_RDX);
  if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
  }
  if (in_RDX != (void *)0x0) {
    this = *(QSurface **)((long)in_RDX + 8);
    SVar1 = QSurface::surfaceClass(this);
    pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
    QVar5.m_data = &DAT_00000008;
    QVar5.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(pQVar3,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    local_68.stream = (Stream *)surface->_vptr_QPlatformSurface;
    if ((local_68.stream)->space == true) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
      local_68.stream = (Stream *)surface->_vptr_QPlatformSurface;
    }
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    qt_QMetaEnum_debugOperator
              ((QDebug *)&local_60,(longlong)&local_68,(QMetaObject *)(ulong)SVar1,
               (char *)&QSurface::staticMetaObject);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
    QVar6.m_data = (storage_type *)0x7;
    QVar6.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar3,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    local_88._16_8_ = surface->_vptr_QPlatformSurface;
    if (*(QTextStream *)(local_88._16_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_88._16_8_,' ');
      local_88._16_8_ = surface->_vptr_QPlatformSurface;
    }
    *(int *)(local_88._16_8_ + 0x28) = *(int *)(local_88._16_8_ + 0x28) + 1;
    uVar2 = (*this->_vptr_QSurface[4])(this);
    qt_QMetaEnum_debugOperator
              ((QDebug *)(local_88 + 0x18),(longlong)(local_88 + 0x10),(QMetaObject *)(ulong)uVar2,
               (char *)&QSurface::staticMetaObject);
    QDebug::~QDebug((QDebug *)(local_88 + 0x18));
    QDebug::~QDebug((QDebug *)(local_88 + 0x10));
    pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
    if (SVar1 == Window) {
      QVar8.m_data = (storage_type *)0x9;
      QVar8.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<(pQVar3,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      local_88._0_8_ = surface->_vptr_QPlatformSurface;
      if (((Stream *)local_88._0_8_)->space == true) {
        QTextStream::operator<<((QTextStream *)local_88._0_8_,' ');
        local_88._0_8_ = surface->_vptr_QPlatformSurface;
      }
      ((Stream *)local_88._0_8_)->ref = ((Stream *)local_88._0_8_)->ref + 1;
      operator<<((Stream *)(local_88 + 8),(QWindow *)local_88);
      QDebug::~QDebug((QDebug *)(local_88 + 8));
      QDebug::~QDebug((QDebug *)local_88);
    }
    else {
      QVar7.m_data = (storage_type *)0xa;
      QVar7.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar3,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
      if (pQVar3[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar3,' ');
        pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
      }
      QTextStream::operator<<(pQVar3,this);
      if (((QTextStream *)surface->_vptr_QPlatformSurface)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,' ');
      }
    }
  }
  QTextStream::operator<<((QTextStream *)surface->_vptr_QPlatformSurface,')');
  pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = (QTextStream *)surface->_vptr_QPlatformSurface;
  }
  surface->_vptr_QPlatformSurface = (_func_int **)0x0;
  *(QTextStream **)debug.stream = pQVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug debug, const QPlatformSurface *surface)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QPlatformSurface(" << (const void *)surface;
    if (surface) {
        QSurface *s = surface->surface();
        auto surfaceClass = s->surfaceClass();
        debug << ", class=" << surfaceClass;
        debug << ", type=" << s->surfaceType();
        if (surfaceClass == QSurface::Window)
            debug << ", window=" << static_cast<QWindow *>(s);
        else
            debug << ", surface=" << s;
    }
    debug << ')';
    return debug;
}